

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O2

int linenoiseHistorySave(char *filename)

{
  __mode_t __mask;
  int iVar1;
  FILE *__stream;
  long lVar2;
  
  __mask = umask(0x7f);
  __stream = fopen(filename,"w");
  umask(__mask);
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
  }
  else {
    chmod(filename,0x180);
    for (lVar2 = 0; lVar2 < history_len; lVar2 = lVar2 + 1) {
      fprintf(__stream,"%s\n",history[lVar2]);
    }
    fclose(__stream);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int linenoiseHistorySave(const char *filename) {
    mode_t old_umask = umask(S_IXUSR|S_IRWXG|S_IRWXO);
    FILE *fp;
    int j;

    fp = fopen(filename,"w");
    umask(old_umask);
    if (fp == NULL) return -1;
    chmod(filename,S_IRUSR|S_IWUSR);
    for (j = 0; j < history_len; j++)
        fprintf(fp,"%s\n",history[j]);
    fclose(fp);
    return 0;
}